

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_mqtt_publish(mg_connection *nc,char *topic,uint16_t message_id,int flags,void *data,
                    size_t len)

{
  char *buf;
  char *nc_00;
  size_t sVar1;
  uint16_t local_3c;
  uint16_t local_3a;
  uint16_t message_id_net;
  size_t sStack_38;
  uint16_t topic_len;
  size_t old_len;
  size_t len_local;
  void *data_local;
  int flags_local;
  uint16_t message_id_local;
  char *topic_local;
  mg_connection *nc_local;
  
  sStack_38 = (nc->send_mbuf).len;
  old_len = len;
  len_local = (size_t)data;
  data_local._0_4_ = flags;
  data_local._6_2_ = message_id;
  _flags_local = topic;
  topic_local = (char *)nc;
  sVar1 = strlen(topic);
  local_3a = htons((uint16_t)sVar1);
  local_3c = htons(data_local._6_2_);
  mg_send((mg_connection *)topic_local,&local_3a,2);
  nc_00 = topic_local;
  buf = _flags_local;
  sVar1 = strlen(_flags_local);
  mg_send((mg_connection *)nc_00,buf,(int)sVar1);
  if ((int)((uint)data_local & 6) >> 1 != 0) {
    mg_send((mg_connection *)topic_local,&local_3c,2);
  }
  mg_send((mg_connection *)topic_local,(void *)len_local,(int)old_len);
  mg_mqtt_prepend_header
            ((mg_connection *)topic_local,'\x03',(uint8_t)(uint)data_local,
             *(long *)(topic_local + 0x60) - sStack_38);
  return;
}

Assistant:

void mg_mqtt_publish(struct mg_connection *nc, const char *topic,
                     uint16_t message_id, int flags, const void *data,
                     size_t len) {
    size_t old_len = nc->send_mbuf.len;

    uint16_t topic_len = htons(strlen(topic));
    uint16_t message_id_net = htons(message_id);

    mg_send(nc, &topic_len, 2);
    mg_send(nc, topic, strlen(topic));
    if (MG_MQTT_GET_QOS(flags) > 0) {
        mg_send(nc, &message_id_net, 2);
    }
    mg_send(nc, data, len);

    mg_mqtt_prepend_header(nc, MG_MQTT_CMD_PUBLISH, flags,
                           nc->send_mbuf.len - old_len);
}